

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O1

void __thiscall QIconLoader::ensureInitialized(QIconLoader *this)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
  QVar4;
  Key KVar5;
  char16_t *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QString override;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
  local_70;
  T local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  char *pcStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_initialized != false) ||
     (QGuiApplicationPrivate::platform_theme == (QPlatformTheme *)0x0)) goto LAB_002785fe;
  this->m_initialized = true;
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable((char *)&local_68);
  if ((undefined1 *)local_68.d.size == (undefined1 *)0x0) {
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (QGuiApplicationPrivate::platform_theme != (QPlatformTheme *)0x0) {
      local_48._16_4_ = 0xaaaaaaaa;
      local_48._20_4_ = 0xaaaaaaaa;
      pcStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_4_ = 0xaaaaaaaa;
      local_48._4_4_ = 0xaaaaaaaa;
      local_48._8_4_ = 0xaaaaaaaa;
      local_48._12_4_ = 0xaaaaaaaa;
      (*QGuiApplicationPrivate::platform_theme->_vptr_QPlatformTheme[0xc])
                (&local_48,QGuiApplicationPrivate::platform_theme,0xe);
      if ((char *)0x3 < pcStack_30) {
        ::QVariant::toString();
        ::QVariant::~QVariant((QVariant *)&local_48);
        goto LAB_0027833a;
      }
      ::QVariant::~QVariant((QVariant *)&local_48);
    }
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    local_68.d.size = 0;
  }
LAB_0027833a:
  pQVar1 = &((this->m_systemTheme).d.d)->super_QArrayData;
  pcVar6 = (this->m_systemTheme).d.ptr;
  (this->m_systemTheme).d.d = local_68.d.d;
  (this->m_systemTheme).d.ptr = local_68.d.ptr;
  qVar2 = (this->m_systemTheme).d.size;
  (this->m_systemTheme).d.size = local_68.d.size;
  local_68.d.d = (Data *)pQVar1;
  local_68.d.ptr = pcVar6;
  local_68.d.size = qVar2;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if ((this->m_systemTheme).d.size == 0) {
    systemFallbackThemeName();
    pQVar1 = &((this->m_systemTheme).d.d)->super_QArrayData;
    pcVar6 = (this->m_systemTheme).d.ptr;
    pDVar3 = (Data *)CONCAT44(local_48._4_4_,local_48._0_4_);
    local_48._0_4_ = SUB84(pQVar1,0);
    local_48._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
    (this->m_systemTheme).d.d = pDVar3;
    (this->m_systemTheme).d.ptr = (char16_t *)CONCAT44(local_48._12_4_,local_48._8_4_);
    local_48._8_4_ = SUB84(pcVar6,0);
    local_48._12_4_ = (undefined4)((ulong)pcVar6 >> 0x20);
    qVar2 = (this->m_systemTheme).d.size;
    (this->m_systemTheme).d.size = CONCAT44(local_48._20_4_,local_48._16_4_);
    local_48._16_4_ = (undefined4)qVar2;
    local_48._20_4_ = (undefined4)((ulong)qVar2 >> 0x20);
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  qt_iconEngineFactoryLoader();
  QFactoryLoader::keyMap();
  QVar9.m_data = (storage_type *)0x3;
  QVar9.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar9);
  local_68.d.d = (Data *)CONCAT44(local_48._4_4_,local_48._0_4_);
  local_68.d.ptr = (char16_t *)CONCAT44(local_48._12_4_,local_48._8_4_);
  local_68.d.size = CONCAT44(local_48._20_4_,local_48._16_4_);
  local_48._0_4_ = 0xffffffff;
  if (local_70.d.ptr ==
      (QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
       *)0x0) {
    bVar8 = true;
  }
  else {
    KVar5 = QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
            ::key((QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
                   *)local_70.d.ptr,&local_68,(Key *)local_48.data);
    bVar8 = KVar5 == -1;
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_70);
  if (!bVar8) {
    this->m_supportsSvg = true;
  }
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_48._0_4_ = 2;
    local_48._4_4_ = 0;
    local_48._8_4_ = 0;
    local_48._12_4_ = 0;
    local_48._16_4_ = 0;
    local_48._20_4_ = 0;
    pcStack_30 = lcIconLoader::category.name;
    QMessageLogger::debug();
    QVar4.d.ptr = local_70.d.ptr;
    QVar10.m_data = (storage_type *)0x29;
    QVar10.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar4.d.ptr,&local_68);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_70.d.ptr + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.d.ptr,' ');
    }
    pcVar6 = (this->m_systemTheme).d.ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_70,(ulong)pcVar6);
    if (*(QTextStream *)((long)local_70.d.ptr + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.d.ptr,' ');
    }
    QVar4.d.ptr = local_70.d.ptr;
    QVar11.m_data = (storage_type *)0xf;
    QVar11.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)QVar4.d.ptr,&local_68);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_70.d.ptr + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.d.ptr,' ');
    }
    pcVar7 = "false";
    if (this->m_supportsSvg != false) {
      pcVar7 = "true";
    }
    QTextStream::operator<<((QTextStream *)local_70.d.ptr,pcVar7);
    if (*(QTextStream *)((long)local_70.d.ptr + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.d.ptr,' ');
    }
    QDebug::~QDebug((QDebug *)&local_70);
  }
LAB_002785fe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconLoader::ensureInitialized()
{
    if (!m_initialized) {
        if (!QGuiApplicationPrivate::platformTheme())
            return; // it's too early: try again later (QTBUG-74252)
        m_initialized = true;
        m_systemTheme = systemThemeName();

        if (m_systemTheme.isEmpty())
            m_systemTheme = systemFallbackThemeName();
        if (qt_iconEngineFactoryLoader()->keyMap().key("svg"_L1, -1) != -1)
            m_supportsSvg = true;

        qCDebug(lcIconLoader) << "Initialized icon loader with system theme"
            << m_systemTheme << "and SVG support" << m_supportsSvg;
    }
}